

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O2

void gen_evcmpeq_speundef(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGv_i64 pTVar1;
  TCGv_i32 pTVar2;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGLabel *l_01;
  TCGLabel *l_02;
  
  if ((ctx->opcode & 1) != 0) {
    gen_speundef(ctx);
    return;
  }
  if (ctx->spe_enabled != false) {
    s = ctx->uc->tcg_ctx;
    l = gen_new_label_ppc64(s);
    l_00 = gen_new_label_ppc64(s);
    l_01 = gen_new_label_ppc64(s);
    l_02 = gen_new_label_ppc64(s);
    tcg_gen_ext32s_i64_ppc64
              (s,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],
               cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
    pTVar1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
    tcg_gen_ext32s_i64_ppc64(s,pTVar1,pTVar1);
    tcg_gen_ext32s_i64_ppc64
              (s,cpu_gprh[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],
               cpu_gprh[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
    pTVar1 = *(TCGv_i64 *)((long)cpu_gprh + (ulong)(ctx->opcode >> 8 & 0xf8));
    tcg_gen_ext32s_i64_ppc64(s,pTVar1,pTVar1);
    tcg_gen_brcond_i64_ppc64
              (s,TCG_COND_EQ,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),
               *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),l);
    tcg_gen_movi_i32(s,*(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38)),0);
    tcg_gen_br(s,l_00);
    gen_set_label(s,l);
    tcg_gen_movi_i32(s,*(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38)),7);
    gen_set_label(s,l_00);
    tcg_gen_brcond_i64_ppc64
              (s,TCG_COND_EQ,*(TCGv_i64 *)((long)cpu_gprh + (ulong)(ctx->opcode >> 0xd & 0xf8)),
               *(TCGv_i64 *)((long)cpu_gprh + (ulong)(ctx->opcode >> 8 & 0xf8)),l_01);
    pTVar2 = *(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38));
    tcg_gen_andi_i32_ppc64(s,pTVar2,pTVar2,-10);
    tcg_gen_br(s,l_02);
    gen_set_label(s,l_01);
    pTVar2 = *(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38));
    tcg_gen_ori_i32_ppc64(s,pTVar2,pTVar2,10);
    gen_set_label(s,l_02);
    return;
  }
  gen_exception(ctx,0x20);
  return;
}

Assistant:

static inline void gen_addr_spe_imm_index(DisasContext *ctx, TCGv EA, int sh)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = rB(ctx->opcode);

    if (rA(ctx->opcode) == 0) {
        tcg_gen_movi_tl(tcg_ctx, EA, uimm << sh);
    } else {
        tcg_gen_addi_tl(tcg_ctx, EA, cpu_gpr[rA(ctx->opcode)], uimm << sh);
        if (NARROW_MODE(ctx)) {
            tcg_gen_ext32u_tl(tcg_ctx, EA, EA);
        }
    }
}